

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O3

void test_common<unsigned_int>(uint length,uint value)

{
  bool bVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  int iVar6;
  long lVar7;
  ulong uVar8;
  undefined1 (*pauVar9) [16];
  undefined8 *puVar10;
  uint uVar11;
  undefined1 (*pauVar12) [16];
  uint uVar13;
  uint uVar14;
  uint uVar15;
  size_t __size;
  undefined1 (*local_70) [16];
  undefined1 (*local_68) [16];
  shared_ptr<unsigned_int> pa;
  undefined1 (*local_50) [16];
  shared_ptr<unsigned_int> pb;
  
  __size = (long)(int)(length + 1) << 2;
  iVar6 = posix_memalign(&local_50,0x10,__size);
  local_68 = (undefined1 (*) [16])0x0;
  if (iVar6 == 0) {
    local_68 = local_50;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_int*,void(*)(unsigned_int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,local_68,
             sse::common::free<unsigned_int>);
  iVar6 = posix_memalign(&local_70,0x10,__size);
  local_50 = (undefined1 (*) [16])0x0;
  if (iVar6 == 0) {
    local_50 = local_70;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_int*,void(*)(unsigned_int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,local_50,
             sse::common::free<unsigned_int>);
  pauVar5 = local_50;
  pauVar4 = local_68;
  uVar3 = (ulong)length;
  *(undefined4 *)(*local_68 + uVar3 * 4) = 0x7f;
  *(undefined4 *)(*local_50 + uVar3 * 4) = 0x3f;
  uVar14 = (int)length >> 2;
  pauVar9 = local_68;
  uVar13 = uVar14;
  uVar11 = uVar14;
  if (3 < (int)uVar14) {
    do {
      *(uint *)*pauVar9 = value;
      *(uint *)(*pauVar9 + 4) = value;
      *(uint *)(*pauVar9 + 8) = value;
      *(uint *)(*pauVar9 + 0xc) = value;
      *(uint *)pauVar9[1] = value;
      *(uint *)(pauVar9[1] + 4) = value;
      *(uint *)(pauVar9[1] + 8) = value;
      *(uint *)(pauVar9[1] + 0xc) = value;
      *(uint *)pauVar9[2] = value;
      *(uint *)(pauVar9[2] + 4) = value;
      *(uint *)(pauVar9[2] + 8) = value;
      *(uint *)(pauVar9[2] + 0xc) = value;
      *(uint *)pauVar9[3] = value;
      *(uint *)(pauVar9[3] + 4) = value;
      *(uint *)(pauVar9[3] + 8) = value;
      *(uint *)(pauVar9[3] + 0xc) = value;
      uVar11 = uVar13 - 4;
      pauVar9 = pauVar9 + 4;
      bVar1 = 7 < uVar13;
      uVar13 = uVar11;
    } while (bVar1);
  }
  if (1 < (int)uVar11) {
    *(uint *)*pauVar9 = value;
    *(uint *)(*pauVar9 + 4) = value;
    *(uint *)(*pauVar9 + 8) = value;
    *(uint *)(*pauVar9 + 0xc) = value;
    *(uint *)pauVar9[1] = value;
    *(uint *)(pauVar9[1] + 4) = value;
    *(uint *)(pauVar9[1] + 8) = value;
    *(uint *)(pauVar9[1] + 0xc) = value;
    uVar11 = uVar11 - 2;
    pauVar9 = pauVar9 + 2;
  }
  if (uVar11 != 0) {
    *(uint *)*pauVar9 = value;
    *(uint *)(*pauVar9 + 4) = value;
    *(uint *)(*pauVar9 + 8) = value;
    *(uint *)(*pauVar9 + 0xc) = value;
  }
  uVar11 = length & 0xfffffffc;
  if (uVar11 != length) {
    lVar7 = (long)(int)uVar11;
    do {
      *(uint *)(*local_68 + lVar7 * 4) = value;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)length);
  }
  if (length != 0) {
    uVar8 = 0;
    do {
      if (*(uint *)(*local_68 + uVar8 * 4) != value) {
        puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar10 = "void test_common(unsigned int, T) [T = unsigned int]";
        *(undefined4 *)(puVar10 + 1) = 0x16;
        *(uint *)((long)puVar10 + 0xc) = length;
        __cxa_throw(puVar10,&Exception::typeinfo,0);
      }
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
    pauVar9 = local_50;
    pauVar12 = local_68;
    uVar13 = uVar14;
    uVar15 = uVar14;
    if (3 < (int)uVar14) {
      do {
        uVar2 = *(undefined8 *)(*pauVar12 + 8);
        *(undefined8 *)*pauVar9 = *(undefined8 *)*pauVar12;
        *(undefined8 *)(*pauVar9 + 8) = uVar2;
        uVar2 = *(undefined8 *)(pauVar12[1] + 8);
        *(undefined8 *)pauVar9[1] = *(undefined8 *)pauVar12[1];
        *(undefined8 *)(pauVar9[1] + 8) = uVar2;
        uVar2 = *(undefined8 *)(pauVar12[2] + 8);
        *(undefined8 *)pauVar9[2] = *(undefined8 *)pauVar12[2];
        *(undefined8 *)(pauVar9[2] + 8) = uVar2;
        uVar2 = *(undefined8 *)(pauVar12[3] + 8);
        *(undefined8 *)pauVar9[3] = *(undefined8 *)pauVar12[3];
        *(undefined8 *)(pauVar9[3] + 8) = uVar2;
        uVar13 = uVar15 - 4;
        pauVar12 = pauVar12 + 4;
        pauVar9 = pauVar9 + 4;
        bVar1 = 7 < uVar15;
        uVar15 = uVar13;
      } while (bVar1);
    }
    if (1 < (int)uVar13) {
      uVar2 = *(undefined8 *)(*pauVar12 + 8);
      *(undefined8 *)*pauVar9 = *(undefined8 *)*pauVar12;
      *(undefined8 *)(*pauVar9 + 8) = uVar2;
      uVar2 = *(undefined8 *)(pauVar12[1] + 8);
      *(undefined8 *)pauVar9[1] = *(undefined8 *)pauVar12[1];
      *(undefined8 *)(pauVar9[1] + 8) = uVar2;
      uVar13 = uVar13 - 2;
      pauVar12 = pauVar12 + 2;
      pauVar9 = pauVar9 + 2;
    }
    if (uVar13 != 0) {
      uVar2 = *(undefined8 *)(*pauVar12 + 8);
      *(undefined8 *)*pauVar9 = *(undefined8 *)*pauVar12;
      *(undefined8 *)(*pauVar9 + 8) = uVar2;
    }
  }
  if (uVar11 != length) {
    lVar7 = (long)(int)uVar11;
    do {
      *(undefined4 *)(*local_50 + lVar7 * 4) = *(undefined4 *)(*local_68 + lVar7 * 4);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)length);
  }
  if (length != 0) {
    uVar8 = 0;
    do {
      if (*(uint *)(*local_50 + uVar8 * 4) != value) {
        puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar10 = "void test_common(unsigned int, T) [T = unsigned int]";
        *(undefined4 *)(puVar10 + 1) = 0x1d;
        *(uint *)((long)puVar10 + 0xc) = length;
        __cxa_throw(puVar10,&Exception::typeinfo,0);
      }
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
    pauVar9 = local_50;
    uVar13 = uVar14;
    if (3 < (int)uVar14) {
      iVar6 = uVar14 - 7;
      if (uVar14 < 7) {
        iVar6 = 0;
      }
      pa.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)(iVar6 + 3U >> 2) * 0x40);
      pb.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           uVar11;
      memset(local_50,0,
             (size_t)(pa.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi + 4));
      uVar13 = (uVar14 - (iVar6 + 3U & 0x7ffffffc)) - 4;
      pauVar9 = (undefined1 (*) [16])
                (pauVar5[4] +
                (long)&(pa.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_vptr__Sp_counted_base);
      uVar11 = pb.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
               _4_4_;
    }
    if (1 < (int)uVar13) {
      uVar13 = uVar13 - 2;
      pauVar9[1] = (undefined1  [16])0x0;
      *pauVar9 = (undefined1  [16])0x0;
      pauVar9 = pauVar9 + 2;
    }
    if (uVar13 != 0) {
      *pauVar9 = (undefined1  [16])0x0;
    }
  }
  if (uVar11 != length) {
    uVar13 = uVar11 | 1;
    if ((int)(uVar11 | 1) < (int)length) {
      uVar13 = length;
    }
    memset(*pauVar5 + (long)(int)uVar11 * 4,0,(ulong)(~uVar11 + uVar13) * 4 + 4);
  }
  if (length != 0) {
    uVar8 = 0;
    do {
      if (*(int *)(*pauVar5 + uVar8 * 4) != 0) {
        puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar10 = "void test_common(unsigned int, T) [T = unsigned int]";
        *(undefined4 *)(puVar10 + 1) = 0x24;
        *(uint *)((long)puVar10 + 0xc) = length;
        __cxa_throw(puVar10,&Exception::typeinfo,0);
      }
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
    if (length != 0) {
      uVar8 = 0;
      do {
        *(int *)(*pauVar4 + uVar8 * 4) = (int)uVar8;
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
      pauVar9 = pauVar5;
      pauVar12 = pauVar4;
      uVar13 = uVar14;
      if (3 < (int)uVar14) {
        do {
          uVar2 = *(undefined8 *)(*pauVar12 + 8);
          *(undefined8 *)*pauVar9 = *(undefined8 *)*pauVar12;
          *(undefined8 *)(*pauVar9 + 8) = uVar2;
          uVar2 = *(undefined8 *)(pauVar12[1] + 8);
          *(undefined8 *)pauVar9[1] = *(undefined8 *)pauVar12[1];
          *(undefined8 *)(pauVar9[1] + 8) = uVar2;
          uVar2 = *(undefined8 *)(pauVar12[2] + 8);
          *(undefined8 *)pauVar9[2] = *(undefined8 *)pauVar12[2];
          *(undefined8 *)(pauVar9[2] + 8) = uVar2;
          uVar2 = *(undefined8 *)(pauVar12[3] + 8);
          *(undefined8 *)pauVar9[3] = *(undefined8 *)pauVar12[3];
          *(undefined8 *)(pauVar9[3] + 8) = uVar2;
          uVar13 = uVar14 - 4;
          pauVar12 = pauVar12 + 4;
          pauVar9 = pauVar9 + 4;
          bVar1 = 7 < uVar14;
          uVar14 = uVar13;
        } while (bVar1);
      }
      if (1 < (int)uVar13) {
        uVar2 = *(undefined8 *)(*pauVar12 + 8);
        *(undefined8 *)*pauVar9 = *(undefined8 *)*pauVar12;
        *(undefined8 *)(*pauVar9 + 8) = uVar2;
        uVar2 = *(undefined8 *)(pauVar12[1] + 8);
        *(undefined8 *)pauVar9[1] = *(undefined8 *)pauVar12[1];
        *(undefined8 *)(pauVar9[1] + 8) = uVar2;
        uVar13 = uVar13 - 2;
        pauVar12 = pauVar12 + 2;
        pauVar9 = pauVar9 + 2;
      }
      if (uVar13 != 0) {
        uVar2 = *(undefined8 *)(*pauVar12 + 8);
        *(undefined8 *)*pauVar9 = *(undefined8 *)*pauVar12;
        *(undefined8 *)(*pauVar9 + 8) = uVar2;
      }
    }
  }
  if (uVar11 != length) {
    lVar7 = (long)(int)uVar11;
    do {
      *(undefined4 *)(*pauVar5 + lVar7 * 4) = *(undefined4 *)(*pauVar4 + lVar7 * 4);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)length);
  }
  if (length != 0) {
    uVar8 = 0;
    do {
      if (uVar8 != *(uint *)(*pauVar5 + uVar8 * 4)) {
        puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar10 = "void test_common(unsigned int, T) [T = unsigned int]";
        *(undefined4 *)(puVar10 + 1) = 0x2d;
        *(uint *)((long)puVar10 + 0xc) = length;
        __cxa_throw(puVar10,&Exception::typeinfo,0);
      }
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  if ((*(int *)(*pauVar4 + uVar3 * 4) == 0x7f) && (*(int *)(*pauVar5 + uVar3 * 4) == 0x3f)) {
    if (pb.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar10 = "void test_common(unsigned int, T) [T = unsigned int]";
  *(undefined4 *)(puVar10 + 1) = 0x31;
  *(uint *)((long)puVar10 + 0xc) = length;
  __cxa_throw(puVar10,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}